

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_3_perl5_regexp(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  G->ss = G->val[-1];
  return;
}

Assistant:

YY_ACTION(void) yy_3_perl5_regexp(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define r G->val[-1]
  yyprintf((stderr, "do yy_3_perl5_regexp"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy=r; }\n"));
  yy=r; ;
#undef r
}